

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::ArraySpliceHelper<void*>
               (JavascriptArray *pnewArr,JavascriptArray *pArr,uint32 start,uint32 deleteLen,
               Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext)

{
  Type *this;
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SparseArraySegment<void_*> *pSVar4;
  SparseArraySegmentBase *pSVar5;
  uint uVar6;
  Type *pTVar7;
  Type *this_00;
  uint32 uVar8;
  uint uVar9;
  uint uVar10;
  SparseArraySegmentBase *pSVar11;
  SparseArraySegmentBase *seg;
  Type *pTVar12;
  Type *local_60;
  Type *local_58;
  
  recycler = scriptContext->recycler;
  if ((pArr->head).ptr == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1c5f,"(pArr->head)","pArr->head");
    if (!bVar2) goto LAB_00a61474;
    *puVar3 = 0;
  }
  this = &pArr->head;
  EnsureHead<void*>(pArr);
  pSVar5 = (pArr->head).ptr;
  pTVar7 = (Type *)this;
  pSVar11 = (SparseArraySegmentBase *)0x0;
  local_58 = (Type *)this;
  do {
    uVar6 = pSVar5->left + pSVar5->size;
    if (CARRY4(pSVar5->left,pSVar5->size)) {
      uVar6 = 0xffffffff;
    }
    do {
      local_60 = pTVar7;
      seg = pSVar5;
      if ((seg == (SparseArraySegmentBase *)0x0) || (start < uVar6)) {
        bVar2 = IsInlineSegment(seg,pArr);
        if (seg == (SparseArraySegmentBase *)0x0) goto LAB_00a611eb;
        uVar9 = deleteLen + start;
        uVar6 = seg->left;
        if ((uVar6 <= start) && (uVar9 <= seg->length + uVar6)) {
          pSVar5 = (seg->next).ptr;
          ArraySegmentSpliceHelper<void*>
                    (pnewArr,(SparseArraySegment<void_*> *)seg,local_60,start,deleteLen,insertArgs,
                     insertLen,recycler);
          while (pSVar11 = pSVar5, pSVar11 != (SparseArraySegmentBase *)0x0) {
            pSVar11->left = pSVar11->left + (insertLen - deleteLen);
            pSVar5 = (pSVar11->next).ptr;
            if (pSVar5 == (SparseArraySegmentBase *)0x0) {
              SparseArraySegmentBase::EnsureSizeInBound(pSVar11);
              pSVar5 = (pSVar11->next).ptr;
            }
          }
          if (*(SparseArraySegmentBase **)local_60 == (SparseArraySegmentBase *)0x0) {
            return;
          }
          SparseArraySegmentBase::EnsureSizeInBound(*(SparseArraySegmentBase **)local_60);
          return;
        }
        this_00 = &pnewArr->head;
        if (uVar6 < start) {
          uVar6 = uVar6 + seg->length;
          uVar8 = uVar6 - start;
          if (start <= uVar6 && uVar8 != 0) {
            pSVar4 = SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                               (recycler,0,uVar8,uVar8,(SparseArraySegmentBase *)0x0);
            pSVar5 = &SparseArraySegment<void_*>::CopySegment
                                (recycler,pSVar4,0,(SparseArraySegment<void_*> *)seg,start,uVar8)->
                      super_SparseArraySegmentBase;
            (pSVar5->next).ptr = (SparseArraySegmentBase *)0x0;
            Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(this_00,pSVar5);
            SparseArraySegment<void_*>::Truncate((SparseArraySegment<void_*> *)seg,start);
            this_00 = &pSVar5->next;
          }
          pSVar11 = seg;
          pTVar7 = (Type *)&seg->next;
        }
        else {
          pTVar12 = local_58;
          pTVar7 = local_60;
          if ((!bVar2) || (pTVar7 = local_60, start < uVar6)) goto LAB_00a60f08;
          uVar10 = seg->length + uVar6;
          uVar8 = uVar10 - start;
          pTVar7 = local_60;
          if (uVar10 < start || uVar8 == 0) {
            if (uVar6 != 0 || seg->length != 0) goto LAB_00a60f08;
            if (seg->size == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar3 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x1cda,"(startSeg->size != 0)","startSeg->size != 0");
              if (!bVar2) goto LAB_00a61474;
              *puVar3 = 0;
            }
            Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                      ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)local_60,&seg->next);
            local_60 = local_58;
          }
          else {
            pSVar4 = SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                               (recycler,0,uVar8,uVar8,(SparseArraySegmentBase *)0x0);
            pSVar5 = &SparseArraySegment<void_*>::CopySegment
                                (recycler,pSVar4,0,(SparseArraySegment<void_*> *)seg,start,uVar8)->
                      super_SparseArraySegmentBase;
            Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(this_00,pSVar5);
            this_00 = &pSVar5->next;
            Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                      ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)local_60,&seg->next);
            (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x73])(pArr,seg,0);
            local_60 = local_58;
          }
        }
        seg = (seg->next).ptr;
        pTVar12 = local_60;
        goto LAB_00a60f08;
      }
      pTVar7 = (Type *)&seg->next;
      pSVar5 = (seg->next).ptr;
      pSVar11 = seg;
      local_58 = local_60;
    } while (pSVar5 == (SparseArraySegmentBase *)0x0);
  } while( true );
LAB_00a60f08:
  local_58 = pTVar7;
  local_60 = local_58;
  if (seg == (SparseArraySegmentBase *)0x0) goto LAB_00a60f4f;
  uVar6 = seg->left;
  if (uVar9 < seg->length + uVar6) {
    bVar2 = false;
    if (pSVar11 != (SparseArraySegmentBase *)0x0) goto LAB_00a61098;
    if (uVar6 != 0) goto LAB_00a60f84;
    uVar6 = 0;
    pSVar11 = (SparseArraySegmentBase *)0x0;
    goto LAB_00a61098;
  }
  pSVar5 = (seg->next).ptr;
  seg->left = uVar6 - start;
  (seg->next).ptr = (SparseArraySegmentBase *)0x0;
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(this_00,seg);
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet
            ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)local_58,pSVar5);
  this_00 = &seg->next;
  seg = pSVar5;
  pTVar7 = local_58;
  goto LAB_00a60f08;
LAB_00a60f4f:
  if (pSVar11 == (SparseArraySegmentBase *)0x0) {
LAB_00a60f84:
    if (this->ptr != seg) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf6,"(pArr->head == startSeg)","pArr->head == startSeg");
      if (!bVar2) goto LAB_00a61474;
      *puVar3 = 0;
    }
    EnsureHeadStartsFromZero<void*>(pArr,recycler);
    pSVar11 = (pArr->head).ptr;
    if ((pSVar11 == (SparseArraySegmentBase *)0x0) || ((pSVar11->next).ptr != seg)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf8,"(pArr->head && pArr->head->next == startSeg)",
                                  "pArr->head && pArr->head->next == startSeg");
      if (!bVar2) goto LAB_00a61474;
      *puVar3 = 0;
      pSVar11 = this->ptr;
    }
    local_60 = (Type *)&pSVar11->next;
    if (seg == (SparseArraySegmentBase *)0x0) {
      seg = (SparseArraySegmentBase *)0x0;
    }
    else {
      uVar6 = seg->left;
      bVar2 = true;
      pTVar12 = local_58;
LAB_00a61098:
      local_58 = pTVar12;
      uVar10 = uVar9 - uVar6;
      if (uVar6 <= uVar9 && uVar10 != 0) {
        pSVar4 = SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                           (recycler,uVar6 - start,uVar10,(SparseArraySegmentBase *)0x0);
        pSVar5 = &SparseArraySegment<void_*>::CopySegment
                            (recycler,pSVar4,seg->left - start,(SparseArraySegment<void_*> *)seg,
                             seg->left,uVar10)->super_SparseArraySegmentBase;
        (pSVar5->next).ptr = (SparseArraySegmentBase *)0x0;
        Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(this_00,pSVar5);
        Memory::
        MoveArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
                  ((WriteBarrierPtr<void> *)(seg + 1),
                   (WriteBarrierPtr<void> *)(&seg[1].left + (ulong)uVar10 * 2),
                   (ulong)(seg->length - uVar10));
        seg->left = seg->left + uVar10;
        seg->length = seg->length - uVar10;
        SparseArraySegmentBase::CheckLengthvsSize(seg);
        SparseArraySegment<void_*>::Truncate
                  ((SparseArraySegment<void_*> *)seg,seg->length + seg->left);
        SparseArraySegmentBase::EnsureSizeInBound(seg);
        uVar6 = seg->left;
      }
      if (bVar2 && (uVar6 - deleteLen) + insertLen == 0) {
        if (uVar6 - deleteLen != start) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1d17,"(start + insertLen == 0)","start + insertLen == 0");
          if (!bVar2) goto LAB_00a61474;
          *puVar3 = 0;
        }
        Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(this,seg);
        pSVar11 = (SparseArraySegmentBase *)0x0;
        local_60 = (Type *)this;
      }
    }
  }
  else {
    seg = (SparseArraySegmentBase *)0x0;
    local_58 = pTVar12;
  }
  while (pSVar5 = seg, pSVar5 != (SparseArraySegmentBase *)0x0) {
    pSVar5->left = pSVar5->left + (insertLen - deleteLen);
    seg = (pSVar5->next).ptr;
    if (seg == (SparseArraySegmentBase *)0x0) {
      SparseArraySegmentBase::EnsureSizeInBound(pSVar5);
      seg = (pSVar5->next).ptr;
    }
  }
LAB_00a611eb:
  SparseArraySegmentBase::EnsureSizeInBound((pnewArr->head).ptr);
  if (pSVar11 != (SparseArraySegmentBase *)0x0) {
    SparseArraySegmentBase::EnsureSizeInBound(pSVar11);
  }
  if (insertLen == 0) {
    return;
  }
  bVar2 = VarIsImpl<Js::JavascriptNativeIntArray>((RecyclableObject *)pArr);
  if ((bVar2) ||
     (bVar2 = VarIsImpl<Js::JavascriptNativeFloatArray>((RecyclableObject *)pArr), bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1d34,
                                "(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr))"
                                ,
                                "!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr)"
                               );
    if (!bVar2) goto LAB_00a61474;
    *puVar3 = 0;
  }
  if (pSVar11 != (SparseArraySegmentBase *)0x0) {
    uVar6 = pSVar11->left;
    if (start < uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1d3a,"(!savePrev || savePrev->left <= start)",
                                  "!savePrev || savePrev->left <= start");
      if (!bVar2) {
LAB_00a61474:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      uVar6 = pSVar11->left;
    }
    uVar9 = pSVar11->size - (start - uVar6);
    if (start - uVar6 <= pSVar11->size && uVar9 != 0) {
      uVar8 = insertLen - uVar9;
      pSVar5 = pSVar11;
      if (uVar9 <= insertLen && uVar8 != 0) {
        bVar2 = IsInlineSegment(pSVar11,pArr);
        pSVar5 = (pSVar11->next).ptr;
        if (pSVar5 == (SparseArraySegmentBase *)0x0) {
          pSVar5 = &SparseArraySegment<void_*>::GrowByMin
                              ((SparseArraySegment<void_*> *)pSVar11,recycler,uVar8)->
                    super_SparseArraySegmentBase;
        }
        else {
          pSVar5 = &SparseArraySegment<void_*>::GrowByMinMax
                              ((SparseArraySegment<void_*> *)pSVar11,recycler,uVar8,
                               pSVar5->left - (pSVar11->left + pSVar11->size))->
                    super_SparseArraySegmentBase;
        }
        if (bVar2) {
          (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                    (pArr,pSVar11,0);
        }
      }
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet
                ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)local_58,pSVar5);
      pSVar5->length = (insertLen + start) - pSVar5->left;
      SparseArraySegmentBase::CheckLengthvsSize(pSVar5);
      goto LAB_00a613da;
    }
  }
  pSVar5 = &SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                      (recycler,start,insertLen,*(SparseArraySegmentBase **)local_60)->
            super_SparseArraySegmentBase;
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
            (&pSVar5->next,(WriteBarrierPtr<Js::SparseArraySegmentBase> *)local_60);
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet
            ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)local_60,pSVar5);
LAB_00a613da:
  Memory::CopyArray<void*,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            ((void **)(&pSVar5[1].left + (ulong)(start - pSVar5->left) * 2),(ulong)insertLen,
             insertArgs,(ulong)insertLen);
  return;
}

Assistant:

void JavascriptArray::ArraySpliceHelper(JavascriptArray* pnewArr, JavascriptArray* pArr, uint32 start, uint32 deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext)
    {
        // Skip pnewArr->EnsureHead(): we don't use existing segment at all.
        Recycler *recycler  = scriptContext->GetRecycler();

        Field(SparseArraySegmentBase*)* prevSeg  = &pArr->head;        // holds the next pointer of previous
        Field(SparseArraySegmentBase*)* prevPrevSeg  = &pArr->head;    // this holds the previous pointer to prevSeg dirty trick.
        SparseArraySegmentBase* savePrev = nullptr;

        Assert(pArr->head); // We should never have a null head.
        pArr->EnsureHead<T>();
        SparseArraySegment<T>* startSeg = SparseArraySegment<T>::From(pArr->head);

        const uint32 limit = start + deleteLen;
        uint32 rightLimit;
        if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
        {
            rightLimit = JavascriptArray::MaxArrayLength;
        }

        // Find out the segment to start delete
        while (startSeg && (rightLimit <= start))
        {
            savePrev = startSeg;
            prevPrevSeg = prevSeg;
            prevSeg = &startSeg->next;
            startSeg = SparseArraySegment<T>::From(startSeg->next);

            if (startSeg)
            {
                if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
                {
                    rightLimit = JavascriptArray::MaxArrayLength;
                }
            }
        }

        bool hasInlineSegment = JavascriptArray::IsInlineSegment(startSeg, pArr);
        if (startSeg)
        {
            // Delete Phase
            if (startSeg->left <= start && (startSeg->left + startSeg->length) >= limit)
            {
                // All splice happens in one segment.
                SparseArraySegmentBase *nextSeg = startSeg->next;
                // Splice the segment first, which might OOM throw but the array would be intact.
                JavascriptArray::ArraySegmentSpliceHelper(
                    pnewArr, startSeg, SparseArraySegment<T>::AddressFrom(prevSeg),
                    start, deleteLen, insertArgs, insertLen, recycler);
                while (nextSeg)
                {
                    // adjust next segments left
                    nextSeg->left = nextSeg->left - deleteLen + insertLen;
                    if (nextSeg->next == nullptr)
                    {
                        nextSeg->EnsureSizeInBound();
                    }
                    nextSeg = nextSeg->next;
                }
                if (*prevSeg)
                {
                    (*prevSeg)->EnsureSizeInBound();
                }
                return;
            }
            else
            {
                SparseArraySegment<T>* newHeadSeg = nullptr; // pnewArr->head is null
                Field(SparseArraySegmentBase*)* prevNewHeadSeg = &pnewArr->head;

                // delete till deleteLen and reuse segments for new array if it is possible.
                // 3 steps -
                //1. delete 1st segment (which may be partial delete)
                // 2. delete next n complete segments
                // 3. delete last segment (which again may be partial delete)

                // Step (1)  -- WOOB 1116297: When left >= start, step (1) is skipped, resulting in pNewArr->head->left != 0. We need to touch up pNewArr.
                if (startSeg->left < start)
                {
                    if (start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;

                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        newHeadSeg->next = nullptr;
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;
                        startSeg->Truncate(start);
                    }
                    savePrev = startSeg;
                    prevPrevSeg = prevSeg;
                    prevSeg = &startSeg->next;
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }

                // Step (2) first we should do a hard copy if we have an inline head Segment
                else if (hasInlineSegment && nullptr != startSeg)
                {
                    // start should be in between left and left + length
                    if (startSeg->left  <= start && start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;
                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;

                        // Remove the entire segment from the original array
                        *prevSeg = startSeg->next;
                        pArr->ClearElements(startSeg, 0);
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                    // if we have an inline head segment with 0 elements, remove it
                    else if (startSeg->left == 0 && startSeg->length == 0)
                    {
                        Assert(startSeg->size != 0);
                        *prevSeg = startSeg->next;
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                }
                // Step (2) proper
                SparseArraySegmentBase *temp = nullptr;
                while (startSeg && (startSeg->left + startSeg->length) <= limit)
                {
                    temp = startSeg->next;

                    // move that entire segment to new array
                    startSeg->left = startSeg->left - start;
                    startSeg->next = nullptr;
                    *prevNewHeadSeg = startSeg;
                    prevNewHeadSeg = &startSeg->next;

                    // Remove the entire segment from the original array
                    *prevSeg = temp;
                    startSeg = (SparseArraySegment<T>*)temp;
                }

                // Step(2) above could delete the original head segment entirely, causing current head not
                // starting from 0. Then if any of the following throw, we have a corrupted array. Need
                // protection here.
                bool dummyHeadNodeInserted = false;
                if (!savePrev && (!startSeg || startSeg->left != 0))
                {
                    Assert(pArr->head == startSeg);
                    pArr->EnsureHeadStartsFromZero<T>(recycler);
                    Assert(pArr->head && pArr->head->next == startSeg);

                    savePrev = pArr->head;
                    prevPrevSeg = prevSeg;
                    prevSeg = &pArr->head->next;
                    dummyHeadNodeInserted = true;
                }

                // Step (3)
                if (startSeg && (startSeg->left < limit))
                {
                    // copy the first part of the last segment to be deleted to new array
                    uint32 headDeleteLen = start + deleteLen - startSeg->left ;

                    newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, startSeg->left -  start, headDeleteLen, (SparseArraySegmentBase *)nullptr);
                    newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, startSeg->left -  start, startSeg, startSeg->left, headDeleteLen);
                    newHeadSeg->next = nullptr;
                    *prevNewHeadSeg = newHeadSeg;
                    prevNewHeadSeg = &newHeadSeg->next;

                    // move the last segment
                    MoveArray(startSeg->elements, startSeg->elements + headDeleteLen, startSeg->length - headDeleteLen);
                    startSeg->left = startSeg->left + headDeleteLen; // We are moving the left ahead to point to the right index
                    startSeg->length = startSeg->length - headDeleteLen;
                    startSeg->CheckLengthvsSize();
                    startSeg->Truncate(startSeg->left + startSeg->length);
                    startSeg->EnsureSizeInBound(); // Just truncated, size might exceed next.left
                }

                if (startSeg && ((startSeg->left - deleteLen + insertLen) == 0) && dummyHeadNodeInserted)
                {
                    Assert(start + insertLen == 0);
                    // Remove the dummy head node to preserve array consistency.
                    pArr->head = startSeg;
                    savePrev = nullptr;
                    prevSeg = &pArr->head;
                }

                while (startSeg)
                {
                    startSeg->left = startSeg->left - deleteLen + insertLen ;
                    if (startSeg->next == nullptr)
                    {
                        startSeg->EnsureSizeInBound();
                    }
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }
            }
        }

        // The size of pnewArr head allocated in above step 1 might exceed next.left concatenated in step 2/3.
        pnewArr->head->EnsureSizeInBound();
        if (savePrev)
        {
            savePrev->EnsureSizeInBound();
        }

        // insert elements
        if (insertLen > 0)
        {
            Assert(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr));

            // InsertPhase
            SparseArraySegment<T> *segInsert = nullptr;

            // see if we are just about the right of the previous segment
            Assert(!savePrev || savePrev->left <= start);
            if (savePrev && (start - savePrev->left < savePrev->size))
            {
                segInsert = (SparseArraySegment<T>*)savePrev;
                uint32 spaceLeft = segInsert->size - (start - segInsert->left);
                if(spaceLeft < insertLen)
                {
                    SparseArraySegment<T> *oldSegInsert = segInsert;
                    bool isInlineSegment = JavascriptArray::IsInlineSegment(segInsert, pArr);
                    if (!segInsert->next)
                    {
                        segInsert = segInsert->GrowByMin(recycler, insertLen - spaceLeft);
                    }
                    else
                    {
                        segInsert = segInsert->GrowByMinMax(recycler, insertLen - spaceLeft, segInsert->next->left - segInsert->left - segInsert->size);
                    }

                    if (isInlineSegment)
                    {
                        pArr->ClearElements(oldSegInsert, 0);
                    }
                }
                *prevPrevSeg = segInsert;
                segInsert->length = start + insertLen - segInsert->left;
                segInsert->CheckLengthvsSize();
            }
            else
            {
                segInsert = SparseArraySegment<T>::AllocateSegment(recycler, start, insertLen, *prevSeg);
                segInsert->next = *prevSeg;
                *prevSeg = segInsert;
                savePrev = segInsert;
            }

            uint32 relativeStart = start - segInsert->left;
            // inserted elements starts at argument 3 of splice(start, deleteNumber, insertelem1, insertelem2, insertelem3, ...);
            CopyArray(segInsert->elements + relativeStart, insertLen,
                      reinterpret_cast<const T*>(insertArgs), insertLen);
        }
    }